

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_indomitable_spirit(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  CHAR_DATA *vict;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RDX,(int)gsn_indomitable_spirit);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
    init_affect((AFFECT_DATA *)0x767816);
    affect_to_char(in_RCX,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void spell_indomitable_spirit(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *vict = (CHAR_DATA *)vo;

	if (is_affected(ch, gsn_indomitable_spirit))
	{
		send_to_char("You are already affected by an indomitable spirit.\n\r", ch);
		return;
	}

	act("You call upon your deity to raise your spirit.", ch, 0, 0, TO_CHAR);
	act("$n calls up on $s deity to raise his spirit.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.owner = ch;
	af.level = ch->level;
	af.type = gsn_indomitable_spirit;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = ch->level / 5;
	af.beat_fun = ispirit_beat;
	af.end_fun = ispirit_end;
	af.mod_name = MOD_TOUGHNESS;
	affect_to_char(ch, &af);
}